

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorFactory.cpp
# Opt level: O1

shared_ptr<ApprovalTests::ApprovalComparator> __thiscall
ApprovalTests::ComparatorFactory::getComparatorForFileExtensionWithDot
          (ComparatorFactory *this,string *fileExtensionWithDot)

{
  _Base_ptr p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  iterator iVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined **ppuVar4;
  shared_ptr<ApprovalTests::ApprovalComparator> sVar5;
  
  comparators_abi_cxx11_();
  iVar2 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
          ::find(&comparators[abi:cxx11]()::allComparators_abi_cxx11_._M_t,fileExtensionWithDot);
  comparators_abi_cxx11_();
  if ((_Rb_tree_header *)iVar2._M_node ==
      &comparators[abi:cxx11]()::allComparators_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    puVar3 = (undefined8 *)operator_new(0x18);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_ptr_inplace_001af718;
    ppuVar4 = &PTR__ApprovalComparator_001af768;
    puVar3[2] = &PTR__ApprovalComparator_001af768;
    *(undefined8 **)this = puVar3 + 2;
    *(undefined8 **)(this + 8) = puVar3;
  }
  else {
    *(undefined8 *)this = *(undefined8 *)(iVar2._M_node + 2);
    p_Var1 = iVar2._M_node[2]._M_parent;
    *(_Base_ptr *)(this + 8) = p_Var1;
    ppuVar4 = (undefined **)extraout_RDX;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
  }
  sVar5.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar4;
  sVar5.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::ApprovalComparator>)
         sVar5.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApprovalComparator>
    ComparatorFactory::getComparatorForFileExtensionWithDot(
        const std::string& fileExtensionWithDot)
    {
        auto iterator = comparators().find(fileExtensionWithDot);
        if (iterator != comparators().end())
        {
            return iterator->second;
        }
        return std::make_shared<TextFileComparator>();
    }